

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int DoGetMasterTID(AActor *self)

{
  AActor *pAVar1;
  player_t *player;
  AActor *self_local;
  
  pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self->master);
  if (pAVar1 == (AActor *)0x0) {
    if (self->FriendPlayer == '\0') {
      self_local._4_4_ = 0;
    }
    else {
      self_local._4_4_ = *(int *)((&players)[(long)(int)(self->FriendPlayer - 1) * 0x54] + 0x260);
    }
  }
  else {
    pAVar1 = TObjPtr<AActor>::operator->(&self->master);
    self_local._4_4_ = pAVar1->tid;
  }
  return self_local._4_4_;
}

Assistant:

int DoGetMasterTID (AActor *self)
{
	if (self->master) return self->master->tid;
	else if (self->FriendPlayer)
	{
		player_t *player = &players[(self->FriendPlayer)-1];
		return player->mo->tid;
	}
	else return 0;
}